

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

Result __thiscall wabt::OutputBuffer::WriteToStdout(OutputBuffer *this)

{
  pointer __ptr;
  pointer puVar1;
  size_t sVar2;
  Enum EVar3;
  
  __ptr = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  EVar3 = Ok;
  if (__ptr != puVar1) {
    sVar2 = fwrite(__ptr,1,(long)puVar1 - (long)__ptr,_stdout);
    if (((long)sVar2 < 0) ||
       (EVar3 = Ok,
       sVar2 != (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start)) {
      WriteToStdout();
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result OutputBuffer::WriteToStdout() const {
  if (data.empty()) {
    return Result::Ok;
  }
  ssize_t bytes = fwrite(data.data(), 1, data.size(), stdout);
  if (bytes < 0 || static_cast<size_t>(bytes) != data.size()) {
    ERROR("failed to write %" PRIzd " bytes to stdout\n", data.size());
    return Result::Error;
  }
  return Result::Ok;
}